

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::PrintFileRuntimePreamble
          (FileGenerator *this,Printer *printer,string *header_to_import)

{
  string *value;
  undefined1 local_78 [8];
  string cpp_symbol;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string framework_name;
  string *header_to_import_local;
  Printer *printer_local;
  FileGenerator *this_local;
  
  framework_name.field_2._8_8_ = header_to_import;
  value = FileDescriptor::name_abi_cxx11_(this->file_);
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"Protobuf",&local_41);
  std::allocator<char>::~allocator(&local_41);
  ProtobufFrameworkImportSymbol((string *)local_78,(string *)local_40);
  io::Printer::Print(printer,
                     "// This CPP symbol can be defined to use imports that match up to the framework\n// imports needed when using CocoaPods.\n#if !defined($cpp_symbol$)\n #define $cpp_symbol$ 0\n#endif\n\n#if $cpp_symbol$\n #import <$framework_name$/$header$>\n#else\n #import \"$header$\"\n#endif\n\n"
                     ,"cpp_symbol",(string *)local_78,"header",
                     (string *)framework_name.field_2._8_8_,"framework_name",(string *)local_40);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void FileGenerator::PrintFileRuntimePreamble(
    io::Printer* printer, const string& header_to_import) const {
  printer->Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", file_->name());

  const string framework_name(ProtobufLibraryFrameworkName);
  const string cpp_symbol(ProtobufFrameworkImportSymbol(framework_name));
  printer->Print(
      "// This CPP symbol can be defined to use imports that match up to the framework\n"
      "// imports needed when using CocoaPods.\n"
      "#if !defined($cpp_symbol$)\n"
      " #define $cpp_symbol$ 0\n"
      "#endif\n"
      "\n"
      "#if $cpp_symbol$\n"
      " #import <$framework_name$/$header$>\n"
      "#else\n"
      " #import \"$header$\"\n"
      "#endif\n"
      "\n",
      "cpp_symbol", cpp_symbol,
      "header", header_to_import,
      "framework_name", framework_name);
}